

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O0

WebAssemblyArrayBuffer * __thiscall
Js::WebAssemblyArrayBuffer::GrowMemory(WebAssemblyArrayBuffer *this,uint32 newBufferLength)

{
  code *pcVar1;
  anon_class_32_4_81194bb1 externalAllocFunc;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  ScriptContext *pSVar5;
  JavascriptLibrary *pJVar6;
  byte *buffer;
  WebAssemblyArrayBuffer *pWVar7;
  ThreadContext *threadContext;
  Recycler *pRVar8;
  WebAssemblyArrayBuffer *newArrayBuffer;
  anon_class_32_4_81194bb1 reallocFunc;
  byte *newBuffer;
  AutoDisableInterrupt autoDisableInterrupt;
  anon_class_16_2_ed7e224f finalizeGrowMemory;
  uint32 growSize;
  uint32 newBufferLength_local;
  WebAssemblyArrayBuffer *this_local;
  
  finalizeGrowMemory.this._4_4_ = newBufferLength;
  if ((this->super_JavascriptArrayBuffer).super_ArrayBuffer.bufferLength <= newBufferLength) {
    finalizeGrowMemory.this._0_4_ =
         newBufferLength - (this->super_JavascriptArrayBuffer).super_ArrayBuffer.bufferLength;
    autoDisableInterrupt._8_8_ = (long)&finalizeGrowMemory.this + 4;
    finalizeGrowMemory.newBufferLength = (uint32 *)this;
    if ((uint32)finalizeGrowMemory.this == 0) {
      pJVar6 = RecyclableObject::GetLibrary((RecyclableObject *)this);
      buffer = (byte *)(**(code **)((long)(this->super_JavascriptArrayBuffer).super_ArrayBuffer.
                                          super_ArrayBufferBase.super_DynamicObject.
                                          super_RecyclableObject.super_FinalizableObject.
                                          super_IRecyclerVisitedObject + 0x390))();
      pWVar7 = JavascriptLibrary::CreateWebAssemblyArrayBuffer
                         (pJVar6,buffer,
                          (this->super_JavascriptArrayBuffer).super_ArrayBuffer.bufferLength);
      this_local = GrowMemory::anon_class_16_2_ed7e224f::operator()
                             ((anon_class_16_2_ed7e224f *)&autoDisableInterrupt.m_operationCompleted
                              ,pWVar7);
    }
    else {
      iVar3 = (**(code **)((long)(this->super_JavascriptArrayBuffer).super_ArrayBuffer.
                                 super_ArrayBufferBase.super_DynamicObject.super_RecyclableObject.
                                 super_FinalizableObject.super_IRecyclerVisitedObject + 0x388))();
      if (iVar3 == 0) {
        if (finalizeGrowMemory.this._4_4_ != (uint32)finalizeGrowMemory.this) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
                                      ,0x466,"(newBufferLength == growSize)",
                                      "newBufferLength == growSize");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        pJVar6 = RecyclableObject::GetLibrary((RecyclableObject *)this);
        pWVar7 = JavascriptLibrary::CreateWebAssemblyArrayBuffer
                           (pJVar6,finalizeGrowMemory.this._4_4_);
        this_local = GrowMemory::anon_class_16_2_ed7e224f::operator()
                               ((anon_class_16_2_ed7e224f *)
                                &autoDisableInterrupt.m_operationCompleted,pWVar7);
      }
      else {
        pSVar5 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
        threadContext = ScriptContext::GetThreadContext(pSVar5);
        AutoDisableInterrupt::AutoDisableInterrupt
                  ((AutoDisableInterrupt *)&newBuffer,threadContext,false);
        reallocFunc.autoDisableInterrupt = (AutoDisableInterrupt *)0x0;
        reallocFunc.this = (WebAssemblyArrayBuffer *)((long)&finalizeGrowMemory.this + 4);
        reallocFunc.newBuffer = (byte **)this;
        reallocFunc.newBufferLength = (uint32 *)&newBuffer;
        pRVar8 = RecyclableObject::GetRecycler((RecyclableObject *)this);
        externalAllocFunc.this = (WebAssemblyArrayBuffer *)reallocFunc.newBuffer;
        externalAllocFunc.newBuffer = (byte **)&reallocFunc.autoDisableInterrupt;
        externalAllocFunc.newBufferLength = (uint32 *)reallocFunc.this;
        externalAllocFunc.autoDisableInterrupt = (AutoDisableInterrupt *)reallocFunc.newBufferLength
        ;
        bVar2 = Memory::Recycler::
                DoExternalAllocation<Js::WebAssemblyArrayBuffer::GrowMemory(unsigned_int)::__1>
                          (pRVar8,(ulong)(uint32)finalizeGrowMemory.this,externalAllocFunc);
        if (bVar2) {
          pRVar8 = RecyclableObject::GetRecycler((RecyclableObject *)this);
          Memory::Recycler::ReportExternalMemoryFree(pRVar8,(ulong)(uint32)finalizeGrowMemory.this);
          pJVar6 = RecyclableObject::GetLibrary((RecyclableObject *)this);
          pWVar7 = JavascriptLibrary::CreateWebAssemblyArrayBuffer
                             (pJVar6,(byte *)reallocFunc.autoDisableInterrupt,
                              finalizeGrowMemory.this._4_4_);
          this_local = GrowMemory::anon_class_16_2_ed7e224f::operator()
                                 ((anon_class_16_2_ed7e224f *)
                                  &autoDisableInterrupt.m_operationCompleted,pWVar7);
          AutoDisableInterrupt::Completed((AutoDisableInterrupt *)&newBuffer);
        }
        else {
          this_local = (WebAssemblyArrayBuffer *)0x0;
        }
        AutoDisableInterrupt::~AutoDisableInterrupt((AutoDisableInterrupt *)&newBuffer);
      }
    }
    return this_local;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
                              ,0x435,"((0))","UNREACHED");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 0;
  pSVar5 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  JavascriptError::ThrowTypeError(pSVar5,-0x7ff5e492,(PCWSTR)0x0);
}

Assistant:

WebAssemblyArrayBuffer* WebAssemblyArrayBuffer::GrowMemory(uint32 newBufferLength)
    {
        if (newBufferLength < this->bufferLength)
        {
            Assert(UNREACHED);
            JavascriptError::ThrowTypeError(GetScriptContext(), WASMERR_BufferGrowOnly);
        }

        uint32 growSize = newBufferLength - this->bufferLength;
        const auto finalizeGrowMemory = [&](WebAssemblyArrayBuffer* newArrayBuffer)
        {
            AssertOrFailFast(newArrayBuffer && newArrayBuffer->GetByteLength() == newBufferLength);
            RefCountedBuffer *local = this->GetBufferContent();
            // Detach the buffer from this ArrayBuffer
            this->Detach();
            if (local != nullptr)
            {
                HeapDelete(local);
            }
            return newArrayBuffer;
        };

        // We're not growing the buffer, just create a new WebAssemblyArrayBuffer and detach this
        if (growSize == 0)
        {
            return finalizeGrowMemory(this->GetLibrary()->CreateWebAssemblyArrayBuffer(this->GetBuffer(), this->bufferLength));
        }

#if ENABLE_FAST_ARRAYBUFFER
        // 8Gb Array case
        if (CONFIG_FLAG(WasmFastArray))
        {
            AssertOrFailFast(this->GetBuffer());
            const auto virtualAllocFunc = [&]
            {
                return !!VirtualAlloc(this->GetBuffer() + this->bufferLength, growSize, MEM_COMMIT, PAGE_READWRITE);
            };
            if (!this->GetRecycler()->DoExternalAllocation(growSize, virtualAllocFunc))
            {
                return nullptr;
            }

            // We are transferring the buffer to the new owner.
            // To avoid double-charge to the allocation quota we will free the "diff" amount here.
            this->GetRecycler()->ReportExternalMemoryFree(growSize);

            return finalizeGrowMemory(this->GetLibrary()->CreateWebAssemblyArrayBuffer(this->GetBuffer(), newBufferLength));
        }
#endif

        // No previous buffer case
        if (this->GetByteLength() == 0)
        {
            Assert(newBufferLength == growSize);
            // Creating a new buffer will do the external memory allocation report
            return finalizeGrowMemory(this->GetLibrary()->CreateWebAssemblyArrayBuffer(newBufferLength));
        }

        // Regular growing case
        {
            // Disable Interrupts while doing a ReAlloc to minimize chances to end up in a bad state
            AutoDisableInterrupt autoDisableInterrupt(this->GetScriptContext()->GetThreadContext(), false);

            byte* newBuffer = nullptr;
            const auto reallocFunc = [&]
            {
                newBuffer = ReallocZero(this->GetBuffer(), this->bufferLength, newBufferLength);
                if (newBuffer != nullptr)
                {
                    // Realloc freed this->buffer
                    // if anything goes wrong before we detach, we can't recover the state and should failfast
                    autoDisableInterrupt.RequireExplicitCompletion();
                }
                return !!newBuffer;
            };

            if (!this->GetRecycler()->DoExternalAllocation(growSize, reallocFunc))
            {
                return nullptr;
            }

            // We are transferring the buffer to the new owner.
            // To avoid double-charge to the allocation quota we will free the "diff" amount here.
            this->GetRecycler()->ReportExternalMemoryFree(growSize);

            WebAssemblyArrayBuffer* newArrayBuffer = finalizeGrowMemory(this->GetLibrary()->CreateWebAssemblyArrayBuffer(newBuffer, newBufferLength));
            // We've successfully Detached this buffer and created a new WebAssemblyArrayBuffer
            autoDisableInterrupt.Completed();
            return newArrayBuffer;
        }
    }